

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.cpp
# Opt level: O1

string * __thiscall
duckdb::ErrorManager::FormatExceptionRecursive_abi_cxx11_
          (string *__return_storage_ptr__,ErrorManager *this,ErrorType error_type,
          vector<duckdb::ExceptionFormatValue,_true> *values)

{
  char *__s;
  pointer pEVar1;
  _Base_ptr p_Var2;
  InternalException *this_00;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  ExceptionFormatValue *val;
  pointer pEVar5;
  vector<duckdb::ExceptionFormatValue,_true> *__range1;
  bool bVar6;
  string error;
  string local_50;
  
  if (INVALIDATED_DATABASE < error_type) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Invalid error type passed to ErrorManager::FormatError","");
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  p_Var4 = &(this->custom_errors)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->custom_errors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var4->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar6]) {
    bVar6 = (ErrorType)p_Var2[1]._M_color < error_type;
    if (!bVar6) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var4) &&
     (p_Var2 = p_Var3, error_type < (ErrorType)p_Var3[1]._M_color)) {
    p_Var2 = &p_Var4->_M_header;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((_Rb_tree_header *)p_Var2 == p_Var4) {
    __s = *(char **)(internal_errors + (ulong)error_type * 0x10 + 8);
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)__s);
    if (error_type == INVALIDATED_DATABASE) {
      pEVar5 = (values->
               super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ).
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (values->
               super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ).
               super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar5 != pEVar1) {
        do {
          bVar6 = StringUtil::Contains(&pEVar5->str_val,&local_50);
          if (bVar6) {
            ::std::__cxx11::string::_M_replace
                      ((ulong)&local_50,0,(char *)local_50._M_string_length,0x1e464b7);
            ExceptionFormatValue::Format
                      (__return_storage_ptr__,&local_50,
                       (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                        *)values);
            if (bVar6) goto LAB_00fc8be9;
          }
          pEVar5 = pEVar5 + 1;
        } while (pEVar5 != pEVar1);
      }
      ::std::__cxx11::string::append((char *)&local_50);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&local_50);
  }
  ExceptionFormatValue::Format
            (__return_storage_ptr__,&local_50,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             values);
LAB_00fc8be9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ErrorManager::FormatExceptionRecursive(ErrorType error_type, vector<ExceptionFormatValue> &values) {
	if (error_type >= ErrorType::ERROR_COUNT) {
		throw InternalException("Invalid error type passed to ErrorManager::FormatError");
	}
	auto entry = custom_errors.find(error_type);
	string error;
	if (entry != custom_errors.end()) {
		// Error was overwritten.
		error = entry->second;
		return ExceptionFormatValue::Format(error, values);
	}

	// Error was not overwritten.
	error = internal_errors[int(error_type)].error;

	if (error_type != ErrorType::INVALIDATED_DATABASE) {
		return ExceptionFormatValue::Format(error, values);
	}

	for (const auto &val : values) {
		if (StringUtil::Contains(val.str_val, error)) {
			error = "%s";
			return ExceptionFormatValue::Format(error, values);
		}
	}
	error += "Original error: \"%s\"";
	return ExceptionFormatValue::Format(error, values);
}